

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iso8601.c
# Opt level: O1

void test_date_io(char *str_in,char *str_out,int64_t millis)

{
  char *__s1;
  int iVar1;
  undefined8 *puVar2;
  
  test_date(str_in,millis);
  puVar2 = (undefined8 *)bson_string_new(0);
  _bson_iso8601_date_format(millis,puVar2);
  __s1 = (char *)*puVar2;
  if (__s1 != str_out) {
    iVar1 = strcmp(__s1,str_out);
    if (iVar1 != 0) {
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",__s1,str_out);
      abort();
    }
  }
  bson_string_free(puVar2,1);
  return;
}

Assistant:

static void
test_date_io (const char *str_in, const char *str_out, int64_t millis)
{
   bson_string_t *bson_str;

   test_date (str_in, millis);

   bson_str = bson_string_new (NULL);
   _bson_iso8601_date_format (millis, bson_str);
   ASSERT_CMPSTR (bson_str->str, str_out);
   bson_string_free (bson_str, true);
}